

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

void Pdr_SetPrintStr(Vec_Str_t *vStr,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  size_t sVar5;
  int iVar6;
  void *__s;
  char *pcVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong __n;
  int iVar11;
  
  __s = malloc((long)(nRegs + 1));
  if (nRegs < 1) {
    __n = 0;
  }
  else {
    __n = (ulong)(uint)nRegs;
    memset(__s,0x2d,__n);
  }
  *(undefined1 *)((long)__s + __n) = 0;
  iVar11 = p->nLits;
  if (0 < (long)iVar11) {
    lVar8 = 0;
    do {
      iVar1 = *(int *)(&p->field_0x14 + lVar8 * 4);
      if (iVar1 != -1) {
        *(byte *)((long)__s + (long)(iVar1 >> 1)) = (byte)iVar1 & 1 ^ 0x31;
      }
      lVar8 = lVar8 + 1;
    } while (iVar11 != lVar8);
  }
  if (vFlopCounts == (Vec_Int_t *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar1 = vFlopCounts->nSize;
    if ((long)iVar1 < 1) {
      iVar11 = 0;
    }
    else {
      piVar4 = vFlopCounts->pArray;
      lVar8 = 0;
      iVar11 = 0;
      do {
        if (piVar4[lVar8] != 0) {
          lVar9 = (long)iVar11;
          iVar11 = iVar11 + 1;
          *(undefined1 *)((long)__s + lVar9) = *(undefined1 *)((long)__s + lVar8);
        }
        lVar8 = lVar8 + 1;
      } while (iVar1 != lVar8);
    }
    *(undefined1 *)((long)__s + (long)iVar11) = 0;
  }
  iVar2 = vStr->nCap;
  iVar10 = vStr->nSize;
  iVar1 = iVar10 + iVar11;
  if ((iVar2 < iVar1) && (iVar6 = iVar1 * 2, SBORROW4(iVar2,iVar6) != iVar2 + iVar1 * -2 < 0)) {
    if (vStr->pArray == (char *)0x0) {
      pcVar7 = (char *)malloc((long)iVar6);
    }
    else {
      pcVar7 = (char *)realloc(vStr->pArray,(long)iVar6);
      iVar10 = vStr->nSize;
    }
    vStr->pArray = pcVar7;
    vStr->nCap = iVar6;
  }
  memcpy(vStr->pArray + iVar10,__s,(long)iVar11);
  iVar11 = iVar11 + vStr->nSize;
  vStr->nSize = iVar11;
  if (iVar11 == vStr->nCap) {
    if (iVar11 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = 0x10;
    }
    else {
      uVar3 = iVar11 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc((ulong)uVar3);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,(ulong)uVar3);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = uVar3;
    }
  }
  else {
    pcVar7 = vStr->pArray;
  }
  iVar11 = vStr->nSize;
  vStr->nSize = iVar11 + 1;
  pcVar7[iVar11] = ' ';
  uVar3 = vStr->nSize;
  if (uVar3 == vStr->nCap) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = 0x10;
    }
    else {
      sVar5 = (ulong)uVar3 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar5);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar5);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = (int)sVar5;
    }
  }
  else {
    pcVar7 = vStr->pArray;
  }
  iVar11 = vStr->nSize;
  vStr->nSize = iVar11 + 1;
  pcVar7[iVar11] = '0';
  uVar3 = vStr->nSize;
  if (uVar3 == vStr->nCap) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = 0x10;
    }
    else {
      sVar5 = (ulong)uVar3 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar5);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar5);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = (int)sVar5;
    }
  }
  else {
    pcVar7 = vStr->pArray;
  }
  iVar11 = vStr->nSize;
  vStr->nSize = iVar11 + 1;
  pcVar7[iVar11] = '\n';
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Pdr_SetPrintStr( Vec_Str_t * vStr, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k = 0, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[lit_var(p->Lits[i])] = (lit_sign(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    Vec_StrPushBuffer( vStr, pBuff, k );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '0' );
    Vec_StrPush( vStr, '\n' );
    ABC_FREE( pBuff );
}